

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O1

int FindDiffVars(int *pDiffVars,Cube *pC1,Cube *pC2)

{
  byte bVar1;
  byte bVar2;
  drow *pdVar3;
  drow *pdVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  
  DiffVarCounter = 0;
  if (0 < (long)g_CoverInfo.nWordsOut) {
    lVar7 = 0;
    do {
      if (pC1->pCubeDataOut[lVar7] != pC2->pCubeDataOut[lVar7]) {
        *pDiffVars = -1;
        DiffVarCounter = 1;
        break;
      }
      lVar7 = lVar7 + 1;
    } while (g_CoverInfo.nWordsOut != lVar7);
  }
  if (g_CoverInfo.nWordsIn < 1) {
    return DiffVarCounter;
  }
  pdVar3 = pC1->pCubeDataIn;
  pdVar4 = pC2->pCubeDataIn;
  lVar7 = 0;
  iVar6 = DiffVarCounter;
  do {
    uVar5 = pdVar4[lVar7] ^ pdVar3[lVar7];
    uVar5 = uVar5 >> 1 | uVar5;
    uVar9 = uVar5 & 0x5555;
    bVar1 = BitCount[uVar9];
    if ((ulong)bVar1 != 0) {
      if (4 < bVar1) {
        return 5;
      }
      bVar2 = BitGroupNumbers[uVar9];
      if (bVar2 == 200) {
        __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                      ,0x157,"int FindDiffVars(int *, Cube *, Cube *)");
      }
      uVar8 = 0;
      do {
        pDiffVars[(long)iVar6 + uVar8] = (uint)GroupLiterals[bVar2][uVar8] + (int)lVar7 * 0x10;
        uVar8 = uVar8 + 1;
      } while (bVar1 != uVar8);
      iVar6 = iVar6 + (int)uVar8;
      DiffVarCounter = iVar6;
    }
    if (4 < iVar6) {
      return 5;
    }
    uVar5 = uVar5 >> 0x10 & 0x5555;
    bVar1 = BitCount[uVar5];
    if ((ulong)bVar1 != 0) {
      if (4 < bVar1) {
        return 5;
      }
      bVar2 = BitGroupNumbers[uVar5];
      if (bVar2 == 200) {
        __assert_fail("BitGroupNumbers[Temp] != MARKNUMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                      ,0x168,"int FindDiffVars(int *, Cube *, Cube *)");
      }
      uVar8 = 0;
      do {
        pDiffVars[(long)iVar6 + uVar8] = (uint)GroupLiterals[bVar2][uVar8] + ((int)lVar7 << 4 | 8U);
        uVar8 = uVar8 + 1;
      } while (bVar1 != uVar8);
      iVar6 = iVar6 + (int)uVar8;
      DiffVarCounter = iVar6;
    }
    if (4 < iVar6) {
      return 5;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 < g_CoverInfo.nWordsIn);
  return DiffVarCounter;
}

Assistant:

int FindDiffVars( int * pDiffVars, Cube * pC1, Cube * pC2 )
// determine different variables in two cubes and 
// writes them into pDiffVars[]
// -1 is written into pDiffVars[0] if the cubes have different outputs
// returns the number of different variables (including the output)
{
    int i, v;
    DiffVarCounter = 0;
    // check whether the output parts of the cubes are different

    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
        if ( pC1->pCubeDataOut[i] != pC2->pCubeDataOut[i] )
        { // they are different
            pDiffVars[0] = -1;
            DiffVarCounter = 1;
            break;
        }

    for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
    {

        Temp1 = pC1->pCubeDataIn[i] ^ pC2->pCubeDataIn[i];
        Temp2 = (Temp1|(Temp1>>1)) & DIFFERENT;

        // check the first part of this word
        Temp = Temp2 & 0xffff;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;

        // check the second part of this word
        Temp = Temp2 >> 16;
        cVars = BitCount[ Temp ];
        if ( cVars )
        {
            if ( cVars < 5 )
                for ( v = 0; v < cVars; v++ )
                {
                    assert( BitGroupNumbers[Temp] != MARKNUMBER );
                    pDiffVars[ DiffVarCounter++ ] = i*16 + 8 + GroupLiterals[ BitGroupNumbers[Temp] ][v];
                }
            else
                return 5;
        }
        if ( DiffVarCounter > 4 )
            return 5;
    }
    return DiffVarCounter;
}